

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

void __thiscall Iex::BaseExc::BaseExc(BaseExc *this,char *s)

{
  char *in_RSI;
  exception *in_RDI;
  char *local_40;
  allocator local_25 [20];
  allocator local_11 [17];
  
  local_40 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_40 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 8),local_40,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__BaseExc_00167d50;
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(in_RDI + 0x28),"",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)((string *)(in_RDI + 0x28));
  }
  return;
}

Assistant:

BaseExc::BaseExc (const char* s) throw () :
    std::string (s? s: ""),
    _stackTrace (currentStackTracer? currentStackTracer(): "")
{
    // empty
}